

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.h
# Opt level: O3

void __thiscall sptk::DiscreteCosineTransform::Buffer::~Buffer(Buffer *this)

{
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00112b48;
  pdVar1 = (this->fourier_transform_imag_part_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->fourier_transform_real_part_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Buffer() {
    }